

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::writeInternal
          (AsyncStreamFd *this,ArrayPtr<const_unsigned_char> firstPiece,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces,ArrayPtr<const_int> fds)

{
  ulong uVar1;
  size_t sVar2;
  PromiseArena *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  byte *pbVar7;
  ArrayPtr<const_unsigned_char> *pAVar8;
  void *pvVar9;
  _func_int **pp_Var10;
  ArrayPtr<const_unsigned_char> *pAVar11;
  _func_int **pp_Var12;
  PromiseFulfiller<void> *elementCount;
  PromiseFulfiller<void> *pPVar13;
  TransformPromiseNodeBase *pTVar14;
  int iVar15;
  _func_int **elementCount_00;
  ulong uVar16;
  ArrayPtr<const_int> *pAVar17;
  OwnPromiseNode *__dest;
  byte *pbVar18;
  _func_int **in_R9;
  _func_int **pp_Var19;
  int iVar20;
  TransformPromiseNodeBase *pTVar21;
  iovec *piVar22;
  bool bVar23;
  ArrayPtr<const_unsigned_char> firstPiece_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_00;
  Array<void_*> cmsgSpace_heap;
  Array<iovec> iov_heap;
  Fault f_1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  iovec iov_stack [16];
  ArrayPtr<const_unsigned_char> *local_2a8;
  PromiseArena *local_2a0;
  undefined1 local_298 [80];
  iovec *local_248;
  _func_int **pp_Stack_240;
  undefined8 *local_238;
  _func_int **local_228;
  Fault local_220;
  msghdr local_218;
  undefined1 local_1d8 [16];
  OwnPromiseNode local_1c8;
  undefined1 *local_1c0;
  bool local_1b8;
  ArrayPtr<const_int> local_158;
  ArrayPtr<const_int> local_148;
  iovec local_138 [16];
  
  local_298._32_8_ = morePieces.size_;
  local_298._40_8_ = morePieces.ptr;
  local_2a0 = (PromiseArena *)firstPiece.size_;
  firstPiece_00.ptr = (PromiseArena *)firstPiece.ptr;
  pp_Var19 = (_func_int **)((long)in_R9 + 1);
  elementCount_00 = (_func_int **)0x400;
  if (pp_Var19 < (_func_int **)0x400) {
    elementCount_00 = pp_Var19;
  }
  if (&DAT_00000010 < pp_Var19) {
    local_248 = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                   (0x10,(size_t)elementCount_00,(size_t)elementCount_00,
                                    (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_238 = &kj::_::HeapArrayDisposer::instance;
    pp_Stack_240 = elementCount_00;
  }
  else {
    local_248 = (iovec *)0x0;
    pp_Stack_240 = (_func_int **)0x0;
    local_238 = (undefined8 *)0x0;
  }
  if (&DAT_00000010 < pp_Var19) {
    elementCount_00 = pp_Stack_240;
  }
  piVar22 = local_138;
  if (&DAT_00000010 < pp_Var19) {
    piVar22 = local_248;
  }
  piVar22->iov_base = local_2a0;
  piVar22->iov_len = local_298._40_8_;
  local_2a8 = (ArrayPtr<const_unsigned_char> *)local_298._40_8_;
  if ((_func_int **)0x1 < elementCount_00) {
    pbVar7 = (byte *)(local_298._32_8_ + 8);
    pp_Var19 = (_func_int **)0x2;
    pp_Var12 = (_func_int **)0x1;
    do {
      pp_Var10 = pp_Var19;
      piVar22[(long)pp_Var12].iov_base = *(void **)(pbVar7 + -8);
      sVar2 = *(size_t *)pbVar7;
      piVar22[(long)pp_Var12].iov_len = sVar2;
      local_2a8 = (ArrayPtr<const_unsigned_char> *)((long)&local_2a8->ptr + sVar2);
      pbVar7 = pbVar7 + 0x10;
      pp_Var19 = (_func_int **)(ulong)((int)pp_Var10 + 1);
      pp_Var12 = pp_Var10;
    } while (pp_Var10 < elementCount_00);
  }
  if (local_2a8 == (ArrayPtr<const_unsigned_char> *)0x0) {
    local_1d8._0_8_ = fds.size_;
    local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
    local_1c8.ptr = (PromiseNode *)0x4a8289;
    local_1c0 = &DAT_00000005;
    local_1b8 = fds.size_ == 0;
    if (!local_1b8) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[30]>
                ((Fault *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x304,FAILED,"fds.size() == 0","_kjCondition,\"can\'t write FDs without bytes\"",
                 (DebugComparison<unsigned_long,_int> *)local_1d8,
                 (char (*) [30])"can\'t write FDs without bytes");
      kj::_::Debug::Fault::fatal((Fault *)&local_218);
    }
    kj::_::readyNow();
  }
  else {
    local_228 = in_R9;
    if (fds.size_ == 0) {
      iVar20 = 0;
      local_298._24_8_ = this;
      do {
        pAVar8 = (ArrayPtr<const_unsigned_char> *)
                 writev(*(int *)((firstPiece_00.ptr)->bytes + 0x10),piVar22,(int)elementCount_00);
        if (-1 < (long)pAVar8) {
          iVar15 = 0;
          break;
        }
        uVar6 = kj::_::Debug::getOsErrorNumber(true);
        in_R9 = (_func_int **)((ulong)in_R9 & 0xffffffff);
        if (uVar6 != 0xffffffff) {
          in_R9 = (_func_int **)(ulong)uVar6;
        }
        iVar15 = (int)in_R9;
      } while (uVar6 == 0xffffffff);
      this = (AsyncStreamFd *)local_298._24_8_;
      pp_Var19 = local_228;
      if (iVar15 != 0) {
        local_218.msg_name = elementCount_00;
        kj::_::Debug::Fault::Fault<int,unsigned_long&,unsigned_long>
                  ((Fault *)local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x30a,iVar15,"n = ::writev(fd, iov.begin(), iov.size())","iovTotal, iov.size()",
                   (unsigned_long *)&local_2a8,(unsigned_long *)&local_218);
        kj::_::Debug::Fault::~Fault((Fault *)local_1d8);
        iVar20 = 0xb;
        this = (AsyncStreamFd *)local_298._24_8_;
        pp_Var19 = local_228;
      }
    }
    else {
      local_218.msg_control = (void *)0x0;
      local_218.msg_controllen = 0;
      local_218.msg_name = (_func_int **)0x0;
      local_218.msg_namelen = 0;
      local_218._12_4_ = 0;
      local_218.msg_flags = 0;
      local_218._52_4_ = 0;
      local_298._24_8_ = fds.size_ * 4 + 7;
      uVar16 = local_298._24_8_ & 0xfffffffffffffff8;
      uVar1 = uVar16 + 0x17;
      elementCount = (PromiseFulfiller<void> *)(uVar1 >> 3);
      local_218.msg_iov = piVar22;
      local_218.msg_iovlen = (size_t)elementCount_00;
      if (uVar1 < 0x88) {
        local_298._48_8_ = (TransformPromiseNodeBase *)0x0;
        local_298._56_8_ = (PromiseFulfiller<void> *)0x0;
        local_298._64_8_ = (Disposer *)0x0;
      }
      else {
        local_298._48_8_ =
             kj::_::HeapArrayDisposer::allocateImpl
                       (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
        local_298._64_8_ = &kj::_::HeapArrayDisposer::instance;
        local_298._56_8_ = elementCount;
      }
      uVar16 = uVar16 + 0x10;
      pPVar13 = (PromiseFulfiller<void> *)local_298._56_8_;
      pTVar14 = (TransformPromiseNodeBase *)local_298._48_8_;
      if (uVar1 < 0x88) {
        pPVar13 = elementCount;
        pTVar14 = (TransformPromiseNodeBase *)local_1d8;
      }
      memset(pTVar14,0,(long)pPVar13 << 3);
      pTVar21 = pTVar14;
      if ((AsyncStreamFd *)0xffffffffffffffef < (ulong)local_298._24_8_) {
        pTVar21 = (TransformPromiseNodeBase *)0x0;
      }
      (pTVar21->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x100000001;
      (pTVar21->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)(fds.size_ * 4 + 0x10);
      __dest = (OwnPromiseNode *)&DAT_00000010;
      if ((AsyncStreamFd *)0xffffffffffffffef >= (ulong)local_298._24_8_) {
        __dest = &pTVar14->dependency;
      }
      local_218.msg_control = pTVar14;
      local_218.msg_controllen = uVar16;
      memcpy(__dest,fds.ptr,fds.size_ << 2);
      iVar20 = 0;
      do {
        pAVar8 = (ArrayPtr<const_unsigned_char> *)
                 sendmsg(*(int *)((firstPiece_00.ptr)->bytes + 0x10),&local_218,0);
        if (-1 < (long)pAVar8) {
          iVar15 = 0;
          break;
        }
        uVar6 = kj::_::Debug::getOsErrorNumber(true);
        uVar16 = uVar16 & 0xffffffff;
        if (uVar6 != 0xffffffff) {
          uVar16 = (ulong)uVar6;
        }
        iVar15 = (int)uVar16;
      } while (uVar6 == 0xffffffff);
      if (iVar15 != 0) {
        local_220.exception = (Exception *)0x0;
        local_298._0_8_ = (UnixEventPort *)0x0;
        local_298._8_4_ = 0;
        local_298._12_4_ = 0;
        kj::_::Debug::Fault::init
                  (&local_220,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::~Fault(&local_220);
        iVar20 = 0xb;
      }
      uVar5 = local_298._56_8_;
      uVar4 = local_298._48_8_;
      pp_Var19 = local_228;
      if ((TransformPromiseNodeBase *)local_298._48_8_ != (TransformPromiseNodeBase *)0x0) {
        local_298._48_8_ = (TransformPromiseNodeBase *)0x0;
        local_298._56_8_ = (PromiseFulfiller<void> *)0x0;
        (***(_func_int ***)local_298._64_8_)(local_298._64_8_,uVar4,8,uVar5,uVar5,0);
        pp_Var19 = local_228;
      }
    }
    if (iVar20 == 0) {
      if ((long)pAVar8 < 0) {
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_298);
        uVar4 = local_298._0_8_;
        pPVar3 = (PromiseArena *)
                 ((SleepHooks *)&((PromiseArenaMember *)local_298._0_8_)->arena)->_vptr_SleepHooks;
        if (pPVar3 == (PromiseArena *)0x0 || (ulong)(local_298._0_8_ - (long)pPVar3) < 0x58) {
          pvVar9 = operator_new(0x400);
          pTVar14 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3a8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar14,(OwnPromiseNode *)local_298,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:833:50)>
                     ::anon_class_56_4_c40b6f0a_for_func::operator());
          *(undefined ***)((long)pvVar9 + 0x3a8) = &PTR_destroy_00649f40;
          *(PromiseArena **)((long)pvVar9 + 0x3c8) = local_2a0;
          *(undefined8 *)((long)pvVar9 + 0x3d0) = local_298._40_8_;
          *(undefined8 *)((long)pvVar9 + 0x3d8) = local_298._32_8_;
          *(_func_int ***)((long)pvVar9 + 0x3e0) = pp_Var19;
          *(int **)((long)pvVar9 + 1000) = fds.ptr;
          *(size_t *)((long)pvVar9 + 0x3f0) = fds.size_;
          *(PromiseArena **)((long)pvVar9 + 0x3f8) = firstPiece_00.ptr;
          *(void **)((long)pvVar9 + 0x3b0) = pvVar9;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_298._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          pTVar14 = (TransformPromiseNodeBase *)
                    &((PromiseArenaMember *)(local_298._0_8_ + -0x60))->arena;
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar14,(OwnPromiseNode *)local_298,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:833:50)>
                     ::anon_class_56_4_c40b6f0a_for_func::operator());
          ((PromiseArenaMember *)(uVar4 + -0x60))->arena = (PromiseArena *)&PTR_destroy_00649f40;
          ((PromiseArenaMember *)(uVar4 + -0x40))->arena = local_2a0;
          ((PromiseArenaMember *)(uVar4 + -0x30))->_vptr_PromiseArenaMember =
               (_func_int **)local_298._40_8_;
          ((PromiseArenaMember *)(uVar4 + -0x30))->arena = (PromiseArena *)local_298._32_8_;
          ((PromiseArenaMember *)(uVar4 + -0x20))->_vptr_PromiseArenaMember = pp_Var19;
          ((PromiseArenaMember *)(uVar4 + -0x20))->arena = (PromiseArena *)fds.ptr;
          ((PromiseArenaMember *)(uVar4 + -0x10))->_vptr_PromiseArenaMember =
               (_func_int **)fds.size_;
          ((PromiseArenaMember *)(uVar4 + -0x10))->arena = firstPiece_00.ptr;
          ((PromiseArenaMember *)(uVar4 + -0x50))->_vptr_PromiseArenaMember = (_func_int **)pPVar3;
        }
        local_1d8._0_8_ = &DAT_004a8171;
        local_1d8._8_8_ = &DAT_004a81d0;
        local_1c8.ptr = (PromiseNode *)&DAT_4c0000058b;
        local_298._48_8_ = pTVar14;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_218,(OwnPromiseNode *)(local_298 + 0x30),
                   (SourceLocation *)local_1d8);
        uVar4 = local_298._48_8_;
        (((AsyncIoStream *)
         &(((PromiseNode *)this)->super_PromiseArenaMember)._vptr_PromiseArenaMember)->
        super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)local_218.msg_name;
        if ((TransformPromiseNodeBase *)local_298._48_8_ != (TransformPromiseNodeBase *)0x0) {
          local_298._48_8_ = (TransformPromiseNodeBase *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
        }
        uVar4 = local_298._0_8_;
        if ((UnixEventPort *)local_298._0_8_ != (UnixEventPort *)0x0) {
          local_298._0_8_ = (UnixEventPort *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
        }
      }
      else {
        if (pAVar8 == (ArrayPtr<const_unsigned_char> *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    ((Fault *)local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x350,FAILED,(char *)0x0,"\"non-empty sendmsg() returned 0\"",
                     (char (*) [31])"non-empty sendmsg() returned 0");
          kj::_::Debug::Fault::fatal((Fault *)local_1d8);
        }
        pAVar11 = (ArrayPtr<const_unsigned_char> *)local_298._40_8_;
        pbVar7 = (byte *)local_298._32_8_;
        if ((ulong)local_298._40_8_ <= pAVar8) {
          do {
            pbVar18 = pbVar7;
            bVar23 = pp_Var19 == (_func_int **)0x0;
            pp_Var19 = (_func_int **)((long)pp_Var19 - 1);
            if (bVar23) {
              kj::_::readyNow();
              goto LAB_0044f697;
            }
            pAVar8 = (ArrayPtr<const_unsigned_char> *)((long)pAVar8 - (long)pAVar11);
            local_2a8 = (ArrayPtr<const_unsigned_char> *)((long)local_2a8 - (long)pAVar11);
            pAVar11 = *(ArrayPtr<const_unsigned_char> **)(pbVar18 + 8);
            pbVar7 = pbVar18 + 0x10;
          } while (pAVar11 <= pAVar8);
          local_2a0 = *(PromiseArena **)pbVar18;
        }
        firstPiece_00.size_ = local_2a0->bytes + (long)pAVar8;
        morePieces_00.ptr = (ArrayPtr<const_unsigned_char> *)((long)pAVar11 - (long)pAVar8);
        local_2a8 = (ArrayPtr<const_unsigned_char> *)((long)local_2a8 - (long)pAVar8);
        pAVar17 = &local_158;
        if (local_2a8 == (ArrayPtr<const_unsigned_char> *)0x0) {
          pAVar17 = &local_148;
        }
        pAVar17->ptr = (int *)0x0;
        pAVar17->size_ = 0;
        morePieces_00.size_ = (size_t)pbVar7;
        writeInternal(this,firstPiece_00,morePieces_00,*pAVar17);
      }
      goto LAB_0044f6a3;
    }
    if (iVar20 != 0xb) goto LAB_0044f6a3;
    kj::_::readyNow();
  }
LAB_0044f697:
  (((AsyncIoStream *)&(((PromiseNode *)this)->super_PromiseArenaMember)._vptr_PromiseArenaMember)->
  super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)local_1d8._0_8_;
LAB_0044f6a3:
  pp_Var19 = pp_Stack_240;
  piVar22 = local_248;
  if (local_248 != (iovec *)0x0) {
    local_248 = (iovec *)0x0;
    pp_Stack_240 = (_func_int **)0x0;
    (**(code **)*local_238)(local_238,piVar22,0x10,pp_Var19,pp_Var19,0);
  }
  return (Promise<void>)(PromiseNode *)this;
}

Assistant:

Promise<void> writeInternal(ArrayPtr<const byte> firstPiece,
                              ArrayPtr<const ArrayPtr<const byte>> morePieces,
                              ArrayPtr<const int> fds) {
    const size_t iovmax = kj::miniposix::iovMax();
    // If there are more than IOV_MAX pieces, we'll only write the first IOV_MAX for now, and
    // then we'll loop later.
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(1 + morePieces.size(), iovmax), 16, 128);
    size_t iovTotal = 0;

    // writev() interface is not const-correct.  :(
    iov[0].iov_base = const_cast<byte*>(firstPiece.begin());
    iov[0].iov_len = firstPiece.size();
    iovTotal += iov[0].iov_len;
    for (uint i = 1; i < iov.size(); i++) {
      iov[i].iov_base = const_cast<byte*>(morePieces[i - 1].begin());
      iov[i].iov_len = morePieces[i - 1].size();
      iovTotal += iov[i].iov_len;
    }

    if (iovTotal == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't write FDs without bytes");
      return kj::READY_NOW;
    }

    ssize_t n;
    if (fds.size() == 0) {
      KJ_NONBLOCKING_SYSCALL(n = ::writev(fd, iov.begin(), iov.size()), iovTotal, iov.size()) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));
      msg.msg_iov = iov.begin();
      msg.msg_iovlen = iov.size();

      // Allocate space to send a cmsg.
      size_t msgBytes = CMSG_SPACE(sizeof(int) * fds.size());
      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

      struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
      cmsg->cmsg_level = SOL_SOCKET;
      cmsg->cmsg_type = SCM_RIGHTS;
      cmsg->cmsg_len = CMSG_LEN(sizeof(int) * fds.size());
      memcpy(CMSG_DATA(cmsg), fds.begin(), fds.asBytes().size());

      KJ_NONBLOCKING_SYSCALL(n = ::sendmsg(fd, &msg, 0)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    }

    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // Got EAGAIN. Nothing was written.
      return observer.whenBecomesWritable().then([firstPiece, morePieces, fds, this]() {
        return writeInternal(firstPiece, morePieces, fds);
      });
    } else if (n == 0) {
      // Why would a sendmsg() with a non-empty message ever return 0 when writing to a stream
      // socket? If there's no room in the send buffer, it should fail with EAGAIN. If the
      // connection is closed, it should fail with EPIPE. Various documents and forum posts around
      // the internet claim this can happen but no one seems to know when. My guess is it can only
      // happen if we try to send an empty message -- which we didn't. So I think this is
      // impossible. If it is possible, we need to figure out how to correctly handle it, which
      // depends on what caused it.
      //
      // Note in particular that if 0 is a valid return here, and we sent an SCM_RIGHTS message,
      // we need to know whether the message was sent or not, in order to decide whether to retry
      // sending it!
      KJ_FAIL_ASSERT("non-empty sendmsg() returned 0");
    }

    // Non-zero bytes were written. This also implies that *all* FDs were written.

    // Discard all data that was written, then issue a new write for what's left (if any).
    for (;;) {
      if (n < firstPiece.size()) {
        // Only part of the first piece was consumed.  Wait for buffer space and then write again.
        firstPiece = firstPiece.slice(n, firstPiece.size());
        iovTotal -= n;

        if (iovTotal == 0) {
          // Oops, what actually happened is that we hit the IOV_MAX limit. Don't wait.
          return writeInternal(firstPiece, morePieces, nullptr);
        }

        // As with read(), we cannot assume that a short write() really means the write buffer is
        // full (see comments in the read path above). We have to write again.
        return writeInternal(firstPiece, morePieces, nullptr);
      } else if (morePieces.size() == 0) {
        // First piece was fully-consumed and there are no more pieces, so we're done.
        KJ_DASSERT(n == firstPiece.size(), n);
        return READY_NOW;
      } else {
        // First piece was fully consumed, so move on to the next piece.
        n -= firstPiece.size();
        iovTotal -= firstPiece.size();
        firstPiece = morePieces[0];
        morePieces = morePieces.slice(1, morePieces.size());
      }
    }
  }